

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O0

void __thiscall Pl_TIFFPredictor::processRow(Pl_TIFFPredictor *this)

{
  bool bVar1;
  Pipeline *pPVar2;
  uchar *puVar3;
  size_type sVar4;
  reference plVar5;
  longlong lVar6;
  byte *pbVar7;
  long lVar8;
  bool local_d9;
  value_type_conflict local_c1;
  ulong local_c0;
  longlong new_sample_1;
  longlong sample_1;
  iterator prev_1;
  iterator pr_end;
  iterator cr_end;
  iterator next_it;
  longlong new_sample;
  longlong sample;
  longlong *prev;
  iterator __end3;
  iterator __begin3;
  vector<long_long,_std::allocator<long_long>_> *__range3;
  undefined1 local_58 [4];
  uint col;
  BitStream in;
  BitWriter bw;
  Pl_TIFFPredictor *this_local;
  
  QTC::TC("libtests","Pl_TIFFPredictor processRow",(uint)(this->action != a_decode));
  bw.bit_offset = 0;
  std::vector<long_long,_std::allocator<long_long>_>::assign
            (&this->previous,(ulong)this->samples_per_pixel,(value_type_conflict2 *)&bw.bit_offset);
  if (this->bits_per_sample == 8) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->out);
    cr_end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->cur_row);
    pr_end._M_current =
         (longlong *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->cur_row)
    ;
    prev_1 = std::vector<long_long,_std::allocator<long_long>_>::end(&this->previous);
    while (bVar1 = __gnu_cxx::operator!=
                             (&cr_end,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&pr_end), bVar1) {
      sample_1 = (longlong)
                 std::vector<long_long,_std::allocator<long_long>_>::begin(&this->previous);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                            *)&sample_1,&prev_1);
        local_d9 = false;
        if (bVar1) {
          local_d9 = __gnu_cxx::operator!=
                               (&cr_end,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&pr_end);
        }
        if (local_d9 == false) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&cr_end);
        local_c0 = (ulong)*pbVar7;
        new_sample_1 = local_c0;
        if (this->action == a_encode) {
          plVar5 = __gnu_cxx::
                   __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                   ::operator*((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                *)&sample_1);
          lVar6 = new_sample_1;
          local_c0 = local_c0 - *plVar5;
          plVar5 = __gnu_cxx::
                   __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                   ::operator*((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                *)&sample_1);
          *plVar5 = lVar6;
        }
        else {
          plVar5 = __gnu_cxx::
                   __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                   ::operator*((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                *)&sample_1);
          lVar8 = *plVar5 + local_c0;
          local_c0 = lVar8;
          plVar5 = __gnu_cxx::
                   __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                   ::operator*((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                *)&sample_1);
          *plVar5 = lVar8;
        }
        local_c1 = (value_type_conflict)local_c0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->out,&local_c1);
        __gnu_cxx::
        __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
        operator++((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                    *)&sample_1);
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&cr_end);
      }
    }
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->out);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->out);
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,puVar3,sVar4);
  }
  else {
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    BitWriter::BitWriter((BitWriter *)&in.bits_available,pPVar2);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->cur_row);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->cur_row);
    BitStream::BitStream((BitStream *)local_58,puVar3,sVar4);
    for (__range3._4_4_ = 0; __range3._4_4_ < this->columns; __range3._4_4_ = __range3._4_4_ + 1) {
      __end3 = std::vector<long_long,_std::allocator<long_long>_>::begin(&this->previous);
      prev = (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(&this->previous);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                         *)&prev), bVar1) {
        plVar5 = __gnu_cxx::
                 __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                 ::operator*(&__end3);
        lVar6 = BitStream::getBitsSigned((BitStream *)local_58,(ulong)this->bits_per_sample);
        if (this->action == a_encode) {
          next_it._M_current = (uchar *)(lVar6 - *plVar5);
          *plVar5 = lVar6;
        }
        else {
          next_it._M_current = (uchar *)(*plVar5 + lVar6);
          *plVar5 = (longlong)next_it._M_current;
        }
        BitWriter::writeBitsSigned
                  ((BitWriter *)&in.bits_available,(longlong)next_it._M_current,
                   (ulong)this->bits_per_sample);
        __gnu_cxx::
        __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
        operator++(&__end3);
      }
    }
    BitWriter::flush((BitWriter *)&in.bits_available);
  }
  return;
}

Assistant:

void
Pl_TIFFPredictor::processRow()
{
    QTC::TC("libtests", "Pl_TIFFPredictor processRow", (action == a_decode ? 0 : 1));
    previous.assign(samples_per_pixel, 0);
    if (bits_per_sample != 8) {
        BitWriter bw(next());
        BitStream in(cur_row.data(), cur_row.size());
        for (unsigned int col = 0; col < this->columns; ++col) {
            for (auto& prev: previous) {
                long long sample = in.getBitsSigned(this->bits_per_sample);
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= prev;
                    prev = sample;
                } else {
                    new_sample += prev;
                    prev = new_sample;
                }
                bw.writeBitsSigned(new_sample, this->bits_per_sample);
            }
        }
        bw.flush();
    } else {
        out.clear();
        auto next_it = cur_row.begin();
        auto cr_end = cur_row.end();
        auto pr_end = previous.end();

        while (next_it != cr_end) {
            for (auto prev = previous.begin(); prev != pr_end && next_it != cr_end;
                 ++prev, ++next_it) {
                long long sample = *next_it;
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= *prev;
                    *prev = sample;
                } else {
                    new_sample += *prev;
                    *prev = new_sample;
                }
                out.push_back(static_cast<unsigned char>(255U & new_sample));
            }
        }
        next()->write(out.data(), out.size());
    }
}